

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O3

void __thiscall QScanConverter::scanConvert<false>(QScanConverter *this)

{
  int y;
  int iVar1;
  Line *pLVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int x;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Line **ppLVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong local_50;
  long local_40;
  
  uVar5 = (this->m_lines).siz;
  if (uVar5 != 0) {
    pLVar2 = (this->m_lines).buffer;
    lVar12 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<QScanConverter::Line*,long,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar2,pLVar2 + uVar5,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<QScanConverter::Line*,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar2);
    y = ((this->m_lines).buffer)->top;
    if (y <= this->m_bottom) {
      local_40 = 0;
      do {
        lVar12 = (long)(int)local_40;
        if (lVar12 < (this->m_lines).siz) {
          lVar14 = lVar12 << 5;
          do {
            pLVar2 = (this->m_lines).buffer;
            local_40 = lVar12;
            if (*(int *)((long)&pLVar2->top + lVar14) != y) break;
            QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,(this->m_active).siz + 1);
            lVar7 = (this->m_active).siz;
            (this->m_active).buffer[lVar7] = (Line *)((long)&pLVar2->x + lVar14);
            (this->m_active).siz = lVar7 + 1;
            lVar12 = lVar12 + 1;
            lVar14 = lVar14 + 0x20;
            local_40 = lVar12;
          } while (lVar12 < (this->m_lines).siz);
        }
        local_50 = (this->m_active).siz;
        uVar11 = (uint)local_50;
        if (1 < (int)uVar11) {
          uVar5 = 1;
          uVar6 = 0;
          lVar12 = 0x100000000;
          do {
            pLVar2 = (this->m_active).buffer[uVar5];
            lVar14 = pLVar2->x;
            lVar7 = lVar12;
            uVar8 = uVar6;
            do {
              ppLVar10 = (this->m_active).buffer;
              if (ppLVar10[uVar8 & 0xffffffff]->x <= lVar14) {
                lVar7 = lVar7 >> 0x20;
                goto LAB_00427f56;
              }
              ppLVar10[uVar8 + 1] = ppLVar10[uVar8 & 0xffffffff];
              lVar7 = lVar7 + -0x100000000;
              lVar9 = uVar8 + 1;
              uVar8 = uVar8 - 1;
            } while (1 < lVar9);
            ppLVar10 = (this->m_active).buffer;
            lVar7 = 0;
LAB_00427f56:
            ppLVar10[lVar7] = pLVar2;
            uVar5 = uVar5 + 1;
            lVar12 = lVar12 + 0x100000000;
            uVar6 = uVar6 + 1;
          } while (uVar5 != (uVar11 & 0x7fffffff));
        }
        if (0 < (int)uVar11) {
          iVar13 = 0;
          uVar11 = 0;
          x = 0;
          do {
            lVar12 = (long)iVar13;
            pLVar2 = (this->m_active).buffer[lVar12];
            iVar1 = *(int *)((long)&pLVar2->x + 2);
            if ((this->m_fillRuleMask & uVar11) != 0) {
              QSpanBuffer::addSpan(this->m_spanBuffer,x,iVar1 - x,y,0xff);
            }
            uVar11 = uVar11 + pLVar2->winding;
            if (pLVar2->bottom == y) {
              uVar4 = (int)local_50 - 1;
              local_50 = (ulong)uVar4;
              lVar14 = (long)(int)uVar4;
              if (iVar13 < (int)uVar4) {
                do {
                  ppLVar10 = (this->m_active).buffer;
                  ppLVar10[lVar12] = ppLVar10[lVar12 + 1];
                  lVar12 = lVar12 + 1;
                } while (lVar14 != lVar12);
              }
              QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,lVar14);
              (this->m_active).siz = lVar14;
            }
            else {
              pLVar2->x = pLVar2->x + pLVar2->delta;
              iVar13 = iVar13 + 1;
            }
            x = iVar1;
          } while (iVar13 < (int)local_50);
        }
        bVar3 = y < this->m_bottom;
        y = y + 1;
      } while (bVar3);
    }
  }
  (this->m_active).siz = 0;
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}